

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O2

void shortcut_in_cb(Shortcut_Button *i,void *v)

{
  Fl_Widget_Type *this;
  bool bVar1;
  int iVar2;
  long lVar3;
  Fl_Type **ppFVar4;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x18])();
    if (iVar2 == 0) {
      iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x19])();
      lVar3 = 0xac;
      if (iVar2 == 0) {
        iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1a])();
        lVar3 = 0x154;
        if (iVar2 == 0) {
          iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1b])();
          if (iVar2 == 0) {
            (*(i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[6])(i);
            return;
          }
          lVar3 = 400;
        }
      }
    }
    else {
      lVar3 = 0x78;
    }
    i->svalue = *(int *)((long)&current_widget->o->_vptr_Fl_Widget + lVar3);
    (*(i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[5])(i);
    Fl_Widget::redraw((Fl_Widget *)i);
    return;
  }
  bVar1 = false;
  ppFVar4 = &Fl_Type::first;
  while (this = (Fl_Widget_Type *)*ppFVar4, this != (Fl_Widget_Type *)0x0) {
    if ((this->super_Fl_Type).selected != '\0') {
      iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])(this);
      if (iVar2 == 0) {
        if ((this->super_Fl_Type).selected != '\0') {
          iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x19])(this);
          if (iVar2 == 0) {
            if ((this->super_Fl_Type).selected != '\0') {
              iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1a])(this);
              if (iVar2 == 0) {
                if ((this->super_Fl_Type).selected != '\0') {
                  iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1b])(this);
                  if (iVar2 != 0) {
                    if (this->o[3].w_ != i->svalue) {
                      bVar1 = true;
                    }
                    this->o[3].w_ = i->svalue;
                  }
                }
              }
              else {
                if (this->o[2].color_ != i->svalue) {
                  bVar1 = true;
                }
                this->o[2].color_ = i->svalue;
              }
            }
          }
          else {
            if (*(int *)((long)&this->o[1].label_.value + 4) != i->svalue) {
              bVar1 = true;
            }
            *(int *)((long)&this->o[1].label_.value + 4) = i->svalue;
          }
        }
      }
      else {
        if (*(int *)&this->o[1]._vptr_Fl_Widget != i->svalue) {
          bVar1 = true;
        }
        *(int *)&this->o[1]._vptr_Fl_Widget = i->svalue;
        iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])(this);
        if (iVar2 != 0) {
          Fl_Widget_Type::redraw(this);
        }
      }
    }
    ppFVar4 = &(this->super_Fl_Type).next;
  }
  if (bVar1) {
    set_modflag(1);
    return;
  }
  return;
}

Assistant:

void shortcut_in_cb(Shortcut_Button* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_button())
      i->svalue = ((Fl_Button*)(current_widget->o))->shortcut();
    else if (current_widget->is_input())
      i->svalue = ((Fl_Input_*)(current_widget->o))->shortcut();
    else if (current_widget->is_value_input())
      i->svalue = ((Fl_Value_Input*)(current_widget->o))->shortcut();
    else if (current_widget->is_text_display())
      i->svalue = ((Fl_Text_Display*)(current_widget->o))->shortcut();
    else {
      i->hide();
      return;
    }
    i->show();
    i->redraw();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next)
      if (o->selected && o->is_button()) {
	Fl_Button* b = (Fl_Button*)(((Fl_Widget_Type*)o)->o);
        if (b->shortcut()!=i->svalue) mod = 1;
	b->shortcut(i->svalue);
	if (o->is_menu_item()) ((Fl_Widget_Type*)o)->redraw();
      } else if (o->selected && o->is_input()) {
	Fl_Input_* b = (Fl_Input_*)(((Fl_Widget_Type*)o)->o);
        if (b->shortcut()!=i->svalue) mod = 1;
	b->shortcut(i->svalue);
      } else if (o->selected && o->is_value_input()) {
	Fl_Value_Input* b = (Fl_Value_Input*)(((Fl_Widget_Type*)o)->o);
        if (b->shortcut()!=i->svalue) mod = 1;
	b->shortcut(i->svalue);
      } else if (o->selected && o->is_text_display()) {
	Fl_Text_Display* b = (Fl_Text_Display*)(((Fl_Widget_Type*)o)->o);
        if (b->shortcut()!=i->svalue) mod = 1;
	b->shortcut(i->svalue);
      }
    if (mod) set_modflag(1);
  }
}